

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ECDecoding.cpp
# Opt level: O2

void do_decode(string *inp,FreqTable *freqs,unordered_map<string,_char2double> *tMap,
              unordered_map<string,_vector<string>_> *motif,json *config,int *codewordLen,
              list<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
              *results,mutex *res_lock)

{
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_538;
  string metric_str;
  string local_4f8;
  string local_4d8;
  SeqEntry dec;
  ECdecoding ecDec;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&metric_str,"ERR",(allocator<char> *)&dec);
  local_538._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_538._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_538._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::__cxx11::string::string((string *)&local_4f8,inp);
  ECdecoding::ECdecoding(&ecDec,&local_4f8,freqs,tMap,true,config);
  std::__cxx11::string::~string((string *)&local_4f8);
  ECdecoding::decode(&dec,&ecDec,*codewordLen,motif,config);
  std::__cxx11::to_string(&local_4d8,dec.metric);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&metric_str,&local_4d8);
  std::__cxx11::string::~string((string *)&local_4d8);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_538,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&dec.ac.bitout);
  SeqEntry::~SeqEntry(&dec);
  ECdecoding::~ECdecoding(&ecDec);
  std::unique_lock<std::mutex>::unique_lock((unique_lock<std::mutex> *)&dec,res_lock);
  std::__cxx11::
  list<std::tuple<std::__cxx11::string,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::allocator<std::tuple<std::__cxx11::string,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>
  ::emplace_back<std::__cxx11::string&,std::vector<unsigned_char,std::allocator<unsigned_char>>&>
            ((list<std::tuple<std::__cxx11::string,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::allocator<std::tuple<std::__cxx11::string,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>
              *)results,&metric_str,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_538);
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&dec);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_538);
  std::__cxx11::string::~string((string *)&metric_str);
  return;
}

Assistant:

void do_decode(const string &inp, FreqTable &freqs, robin_hood::unordered_map<string, char2double> &tMap, robin_hood::unordered_map<string, vector<string>> &motif,
               nlohmann::json &config, int &codewordLen, list<tuple<string, vector<unsigned char>>> &results, std::mutex *res_lock) {
    string metric_str = "ERR";
    vector<unsigned char> data = {};
    try {
        ECdecoding ecDec = ECdecoding(inp, freqs, tMap, true, config);
        SeqEntry dec = ecDec.decode(codewordLen, motif, config);
        metric_str = to_string(dec.metric);
        data = *dec.ac.bitout.get_data();
    }
    catch (...) {
        WARN("No candidate found.");
    }
    {
        std::unique_lock<std::mutex> uLock(*res_lock);
        results.emplace_back(metric_str, data);
    }
}